

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O2

int cpu_scaling_min_freq(int cpu)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int min_freq;
  char *filename;
  
  filename = (char *)0x0;
  iVar1 = asprintf(&filename,"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_min_freq",cpu);
  iVar2 = -1;
  if (iVar1 != -1) {
    __stream = fopen(filename,"r");
    free(filename);
    if (__stream != (FILE *)0x0) {
      iVar2 = __isoc99_fscanf(__stream,"%d",&min_freq);
      if (iVar2 != 1) {
        min_freq = -1;
      }
      fclose(__stream);
      iVar2 = min_freq;
    }
  }
  return iVar2;
}

Assistant:

int
cpu_scaling_min_freq(int cpu)
{
	int min_freq;
	FILE *fp;
	char *filename = NULL;
	if (asprintf(&filename,
		"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_min_freq",
			cpu) == -1) {
		return -1;
	}
	fp = fopen(filename, "r");
	free(filename);
	if (!fp)
		return -1;
	if (fscanf(fp, "%d", &min_freq) != 1)
		min_freq = -1;
	fclose(fp);
	return min_freq;
}